

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::clear
          (array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *this)

{
  vector3_base<int> *pvVar1;
  
  allocator_default<vector3_base<int>_>::free_array(this->list);
  this->list_size = 1;
  pvVar1 = (vector3_base<int> *)operator_new__(0xc);
  this->list = pvVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}